

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BIT_STRING.c
# Opt level: O0

int BIT_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                    void *app_key)

{
  int iVar1;
  byte *pbVar2;
  code *in_RCX;
  int in_EDX;
  char *pcVar3;
  long *in_RSI;
  undefined8 in_R8;
  int tmp_i_1;
  int tmp_i;
  char *p;
  uint8_t *end;
  uint8_t *buf;
  BIT_STRING_t *st;
  char scratch [64];
  char *h2c;
  int local_a0;
  int local_9c;
  char *local_98;
  byte *local_88;
  char local_78 [64];
  char *local_38;
  undefined8 local_30;
  code *local_28;
  int local_1c;
  int local_4;
  
  local_38 = "0123456789ABCDEF";
  local_98 = local_78;
  if ((in_RSI == (long *)0x0) || (*in_RSI == 0)) {
    iVar1 = (*in_RCX)("<absent>",8,in_R8);
    local_4 = 0;
    if (iVar1 < 0) {
      local_4 = -1;
    }
  }
  else {
    local_1c = in_EDX + 1;
    local_88 = (byte *)*in_RSI;
    pbVar2 = local_88 + (int)in_RSI[1];
    local_30 = in_R8;
    local_28 = in_RCX;
    for (; local_88 < pbVar2; local_88 = local_88 + 1) {
      if (((((long)local_88 - *in_RSI) % 0x10 == 0) && (0x10 < (int)in_RSI[1])) &&
         (local_88 != (byte *)*in_RSI)) {
        iVar1 = (*local_28)("\n",1,local_30);
        if (iVar1 < 0) {
          return -1;
        }
        for (local_9c = 0; local_9c < local_1c; local_9c = local_9c + 1) {
          iVar1 = (*local_28)(" ",1,local_30);
          if (iVar1 < 0) {
            return -1;
          }
        }
        iVar1 = (*local_28)(local_78,(long)local_98 - (long)local_78,local_30);
        if (iVar1 < 0) {
          return -1;
        }
        local_98 = local_78;
      }
      *local_98 = "0123456789ABCDEF"[(int)(uint)*local_88 >> 4];
      pcVar3 = local_98 + 2;
      local_98[1] = "0123456789ABCDEF"[(int)(*local_88 & 0xf)];
      local_98 = local_98 + 3;
      *pcVar3 = ' ';
    }
    if (local_78 < local_98) {
      if (0x10 < (int)in_RSI[1]) {
        iVar1 = (*local_28)("\n",1,local_30);
        if (iVar1 < 0) {
          return -1;
        }
        for (local_a0 = 0; local_a0 < local_1c; local_a0 = local_a0 + 1) {
          iVar1 = (*local_28)(" ",1,local_30);
          if (iVar1 < 0) {
            return -1;
          }
        }
      }
      iVar1 = (*local_28)(local_78,local_98 + (-1 - (long)local_78),local_30);
      if (iVar1 < 0) {
        return -1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
BIT_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	char scratch[64];
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	uint8_t *buf;
	uint8_t *end;
	char *p = scratch;

	(void)td;	/* Unused argument */

	if(!st || !st->buf)
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	ilevel++;
	buf = st->buf;
	end = buf + st->size;

	/*
	 * Hexadecimal dump.
	 */
	for(; buf < end; buf++) {
		if((buf - st->buf) % 16 == 0 && (st->size > 16)
				&& buf != st->buf) {
			_i_INDENT(1);
			/* Dump the string */
			if(cb(scratch, p - scratch, app_key) < 0) return -1;
			p = scratch;
		}
		*p++ = h2c[*buf >> 4];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Eat the tailing space */

		if((st->size > 16)) {
			_i_INDENT(1);
		}

		/* Dump the incomplete 16-bytes row */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}